

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrint(char *string)

{
  char *local_18;
  char *pch;
  char *string_local;
  
  local_18 = string;
  if (string != (char *)0x0) {
    for (; *local_18 != '\0'; local_18 = local_18 + 1) {
      if ((*local_18 < '\x7f') && ('\x1f' < *local_18)) {
        putchar((int)*local_18);
      }
      else if (*local_18 == '\r') {
        putchar(0x5c);
        putchar(0x72);
      }
      else if (*local_18 == '\n') {
        putchar(0x5c);
        putchar(0x6e);
      }
      else {
        putchar(0x5c);
        putchar(0x78);
        UnityPrintNumberHex((long)*local_18,'\x02');
      }
    }
  }
  return;
}

Assistant:

void UnityPrint(const char* string)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch)
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((_U_UINT)*pch, 2);
            }
            pch++;
        }
    }
}